

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid_checker.hpp
# Opt level: O2

void duckdb::ValidChecker::Invalidate<duckdb::MetaTransaction>(MetaTransaction *o,string *error)

{
  undefined8 uVar1;
  string asStack_38 [32];
  
  uVar1 = duckdb::ValidChecker::Get(o);
  std::__cxx11::string::string(asStack_38,(string *)error);
  duckdb::ValidChecker::Invalidate(uVar1,asStack_38);
  std::__cxx11::string::~string(asStack_38);
  return;
}

Assistant:

static void Invalidate(T &o, string error) {
		Get(o).Invalidate(std::move(error));
	}